

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmComputeLinkInformation * __thiscall
cmGeneratorTarget::GetLinkInformation(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  cmComputeLinkInformation *pcVar2;
  pointer ppVar3;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_cmComputeLinkInformation_*>_&>::value,_pair<iterator,_bool>_>
  _Var4;
  undefined1 local_88 [8];
  value_type entry;
  cmComputeLinkInformation *info;
  _Self local_40;
  iterator i;
  string key;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  cmsys::SystemTools::UpperCase((string *)&i,config);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>_>_>
       ::find(&this->LinkInformation,(string *)&i);
  info = (cmComputeLinkInformation *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>_>_>
         ::end(&this->LinkInformation);
  bVar1 = std::operator==(&local_40,(_Self *)&info);
  if (bVar1) {
    pcVar2 = (cmComputeLinkInformation *)operator_new(0x778);
    cmComputeLinkInformation::cmComputeLinkInformation(pcVar2,this,config);
    entry.second = pcVar2;
    if ((pcVar2 == (cmComputeLinkInformation *)0x0) ||
       (bVar1 = cmComputeLinkInformation::Compute(pcVar2), !bVar1)) {
      pcVar2 = entry.second;
      if (entry.second != (cmComputeLinkInformation *)0x0) {
        cmComputeLinkInformation::~cmComputeLinkInformation(entry.second);
        operator_delete(pcVar2,0x778);
      }
      entry.second = (cmComputeLinkInformation *)0x0;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmComputeLinkInformation_*&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>
                *)local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
               &entry.second);
    _Var4 = std::
            map<std::__cxx11::string,cmComputeLinkInformation*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>>>
            ::insert<std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>&>
                      ((map<std::__cxx11::string,cmComputeLinkInformation*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>>>
                        *)&this->LinkInformation,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>
                        *)local_88);
    local_40._M_node = (_Base_ptr)_Var4.first._M_node;
    if (entry.second != (cmComputeLinkInformation *)0x0) {
      CheckPropertyCompatibility(this,entry.second,config);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>
             *)local_88);
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>_>
           ::operator->(&local_40);
  pcVar2 = ppVar3->second;
  std::__cxx11::string::~string((string *)&i);
  return pcVar2;
}

Assistant:

cmComputeLinkInformation* cmGeneratorTarget::GetLinkInformation(
  const std::string& config) const
{
  // Lookup any existing information for this configuration.
  std::string key(cmSystemTools::UpperCase(config));
  cmTargetLinkInformationMap::iterator i = this->LinkInformation.find(key);
  if (i == this->LinkInformation.end()) {
    // Compute information for this configuration.
    cmComputeLinkInformation* info =
      new cmComputeLinkInformation(this, config);
    if (!info || !info->Compute()) {
      delete info;
      info = CM_NULLPTR;
    }

    // Store the information for this configuration.
    cmTargetLinkInformationMap::value_type entry(key, info);
    i = this->LinkInformation.insert(entry).first;

    if (info) {
      this->CheckPropertyCompatibility(info, config);
    }
  }
  return i->second;
}